

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_dr_flac__seek_flac_frame(ma_dr_flac *pFlac)

{
  ma_dr_flac_bs *bs;
  char cVar1;
  ma_uint8 mVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  ma_bool32 mVar6;
  uint uVar7;
  uint uVar8;
  undefined8 in_RAX;
  ulong uVar9;
  ushort uVar10;
  ma_result mVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  size_t bitsToSeek;
  long lVar15;
  ma_uint16 desiredCRC16;
  undefined8 uStack_38;
  
  cVar1 = (&DAT_0019be50)[(char)(pFlac->currentFLACFrame).header.channelAssignment];
  bs = &pFlac->bs;
  lVar15 = 0;
  uStack_38 = in_RAX;
  do {
    mVar6 = ma_dr_flac__read_subframe_header
                      (bs,(ma_dr_flac_subframe *)
                          (&(pFlac->currentFLACFrame).subframes[0].subframeType + lVar15));
    if (mVar6 == 0) {
      return MA_ERROR;
    }
    mVar2 = (pFlac->currentFLACFrame).header.channelAssignment;
    uVar13 = (uint)(pFlac->currentFLACFrame).header.bitsPerSample;
    if (mVar2 == '\b') {
      if (lVar15 != 0x10) goto LAB_0018db9e;
LAB_0018dbc2:
      uVar13 = uVar13 + 1;
    }
    else {
      if (lVar15 == 0x10 && mVar2 == '\n') goto LAB_0018dbc2;
LAB_0018db9e:
      uVar13 = uVar13 + (lVar15 == 0 && mVar2 == '\t');
    }
    uVar7 = (uint)(&(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample)[lVar15];
    uVar14 = uVar13 - uVar7;
    if (uVar13 < uVar7 || uVar14 == 0) {
      return MA_ERROR;
    }
    *(undefined8 *)((long)&(pFlac->currentFLACFrame).subframes[0].pSamplesS32 + lVar15) = 0;
    bVar3 = (&(pFlac->currentFLACFrame).subframes[0].subframeType)[lVar15];
    if (bVar3 < 8) {
      if (bVar3 != 0) {
        if (bVar3 != 1) {
          return MA_ERROR;
        }
        uVar14 = uVar14 * (pFlac->currentFLACFrame).header.blockSizeInPCMFrames;
      }
      mVar6 = ma_dr_flac__seek_bits(bs,(ulong)uVar14);
    }
    else {
      if (bVar3 == 8) {
        bitsToSeek = (size_t)(uVar14 * (&(pFlac->currentFLACFrame).subframes[0].lpcOrder)[lVar15]);
      }
      else {
        if (bVar3 != 0x20) {
          return MA_ERROR;
        }
        mVar6 = ma_dr_flac__seek_bits
                          (bs,(ulong)(uVar14 * (&(pFlac->currentFLACFrame).subframes[0].lpcOrder)
                                               [lVar15]));
        if (mVar6 == 0) {
          return MA_ERROR;
        }
        mVar6 = ma_dr_flac__read_uint8(bs,4,(ma_uint8 *)((long)&uStack_38 + 5));
        if (mVar6 == 0) {
          return MA_ERROR;
        }
        if (uStack_38._5_1_ == '\x0f') {
          return MA_ERROR;
        }
        bitsToSeek = (ulong)(byte)(uStack_38._5_1_ + 1) *
                     (ulong)(&(pFlac->currentFLACFrame).subframes[0].lpcOrder)[lVar15] + 5;
      }
      mVar6 = ma_dr_flac__seek_bits(bs,bitsToSeek);
      if (mVar6 == 0) {
        return MA_ERROR;
      }
      mVar6 = ma_dr_flac__read_and_seek_residual
                        (bs,(uint)(pFlac->currentFLACFrame).header.blockSizeInPCMFrames,
                         (uint)(&(pFlac->currentFLACFrame).subframes[0].lpcOrder)[lVar15]);
    }
    if (mVar6 == 0) {
      return MA_ERROR;
    }
    lVar15 = lVar15 + 0x10;
    if ((ulong)(byte)(cVar1 + (cVar1 == '\0')) * 0x10 == lVar15) {
      mVar6 = ma_dr_flac__seek_bits(bs,(ulong)(-(pFlac->bs).consumedBits & 7));
      mVar11 = MA_ERROR;
      if (mVar6 != 0) {
        uVar13 = (pFlac->bs).consumedBits;
        uVar10 = (pFlac->bs).crc16;
        uVar12 = (ulong)uVar10;
        uVar7 = (uint)uVar10;
        uVar9 = (pFlac->bs).crc16Cache;
        if (uVar13 == 0x40) {
          uVar8 = (uint)uVar9;
          uVar4 = (ushort)(uVar9 >> 0x30);
          uVar14 = (uint)(uVar9 >> 0x10);
          uVar13 = (uint)(uVar9 >> 0x18);
          uVar5 = (uint)(uVar9 >> 0x20);
          switch((pFlac->bs).crc16CacheIgnoredBytes) {
          case 0:
            uVar10 = ma_dr_flac__crc16_table
                     [((uint)ma_dr_flac__crc16_table
                             [((uint)ma_dr_flac__crc16_table
                                     [(uVar5 >> 8 ^
                                      ((uint)ma_dr_flac__crc16_table
                                             [(uint)(uVar10 >> 8) ^ (uint)(byte)(uVar9 >> 0x38)] <<
                                       8 ^ (uint)ma_dr_flac__crc16_table
                                                 [((uint)uVar4 ^
                                                  ((uint)uVar10 << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uint)(uVar10 >> 8) ^
                                                         (uint)(byte)(uVar9 >> 0x38)]) >> 8 & 0xff)
                                                  & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                              (uint)ma_dr_flac__crc16_table
                                    [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar4 ^
                                                      ((uint)uVar10 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar10 >> 8) ^
                                                             (uint)(byte)(uVar9 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff] << 8 ^
                                              (uint)ma_dr_flac__crc16_table
                                                    [(uVar5 >> 8 ^
                                                     ((uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar10 >> 8) ^
                                                             (uint)(byte)(uVar9 >> 0x38)] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [((uint)uVar4 ^
                                                            ((uint)uVar10 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar10 >> 8) ^
                                                                   (uint)(byte)(uVar9 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff])
                                              >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar13 & 0xff] <<
                       8 ^ uVar8 ^
                      (uint)ma_dr_flac__crc16_table
                            [(((uint)ma_dr_flac__crc16_table
                                     [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                      [((uint)uVar4 ^
                                                       ((uint)uVar10 << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar10 >> 8) ^
                                                              (uint)(byte)(uVar9 >> 0x38)]) >> 8 &
                                                       0xff) & 0xff] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [(uVar5 >> 8 ^
                                                      ((uint)ma_dr_flac__crc16_table
                                                             [(uint)(uVar10 >> 8) ^
                                                              (uint)(byte)(uVar9 >> 0x38)] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar4 ^
                                                             ((uint)uVar10 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar10 >> 8) ^
                                                                    (uint)(byte)(uVar9 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                               ) >> 8 & 0xff) & 0xff] << 8 ^
                              (uint)ma_dr_flac__crc16_table
                                    [((uint)ma_dr_flac__crc16_table
                                            [(uVar5 >> 8 ^
                                             ((uint)ma_dr_flac__crc16_table
                                                    [(uint)(uVar10 >> 8) ^
                                                     (uint)(byte)(uVar9 >> 0x38)] << 8 ^
                                             (uint)ma_dr_flac__crc16_table
                                                   [((uint)uVar4 ^
                                                    ((uint)uVar10 << 8 ^
                                                    (uint)ma_dr_flac__crc16_table
                                                          [(uint)(uVar10 >> 8) ^
                                                           (uint)(byte)(uVar9 >> 0x38)]) >> 8 & 0xff
                                                    ) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                     (uint)ma_dr_flac__crc16_table
                                           [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                            [((uint)uVar4 ^
                                                             ((uint)uVar10 << 8 ^
                                                             (uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar10 >> 8) ^
                                                                    (uint)(byte)(uVar9 >> 0x38)]) >>
                                                             8 & 0xff) & 0xff] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uVar5 >> 8 ^
                                                            ((uint)ma_dr_flac__crc16_table
                                                                   [(uint)(uVar10 >> 8) ^
                                                                    (uint)(byte)(uVar9 >> 0x38)] <<
                                                             8 ^ (uint)ma_dr_flac__crc16_table
                                                                       [((uint)uVar4 ^
                                                                        ((uint)uVar10 << 8 ^
                                                                        (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar10 >> 8) ^ (uint)(byte)(uVar9 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar13 & 0xff])
                              >> 8 & 0xff ^ uVar14 & 0xffff) & 0xff]) >> 8 & 0xff] << 8 ^
                     ma_dr_flac__crc16_table
                     [(((uint)ma_dr_flac__crc16_table
                              [(((uint)ma_dr_flac__crc16_table
                                       [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                        [((uint)uVar4 ^
                                                         ((uint)uVar10 << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar10 >> 8) ^
                                                                (uint)(byte)(uVar9 >> 0x38)]) >> 8 &
                                                         0xff) & 0xff] << 8 ^
                                                 (uint)ma_dr_flac__crc16_table
                                                       [(uVar5 >> 8 ^
                                                        ((uint)ma_dr_flac__crc16_table
                                                               [(uint)(uVar10 >> 8) ^
                                                                (uint)(byte)(uVar9 >> 0x38)] << 8 ^
                                                        (uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar4 ^
                                                               ((uint)uVar10 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar10 >> 8) ^
                                                                      (uint)(byte)(uVar9 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                        0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                (uint)ma_dr_flac__crc16_table
                                      [((uint)ma_dr_flac__crc16_table
                                              [(uVar5 >> 8 ^
                                               ((uint)ma_dr_flac__crc16_table
                                                      [(uint)(uVar10 >> 8) ^
                                                       (uint)(byte)(uVar9 >> 0x38)] << 8 ^
                                               (uint)ma_dr_flac__crc16_table
                                                     [((uint)uVar4 ^
                                                      ((uint)uVar10 << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar10 >> 8) ^
                                                             (uint)(byte)(uVar9 >> 0x38)]) >> 8 &
                                                      0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                       (uint)ma_dr_flac__crc16_table
                                             [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar4 ^
                                                               ((uint)uVar10 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar10 >> 8) ^
                                                                      (uint)(byte)(uVar9 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar5 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar10 >> 8) ^
                                                                      (uint)(byte)(uVar9 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar4 ^
                                                                             ((uint)uVar10 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar10 >> 8) ^ (uint)(byte)(uVar9 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar13 & 0xff])
                                >> 8 & 0xff ^ uVar14 & 0xffff) & 0xff] << 8 ^
                       (uint)ma_dr_flac__crc16_table
                             [((uint)ma_dr_flac__crc16_table
                                     [((uint)ma_dr_flac__crc16_table
                                             [(uVar5 >> 8 ^
                                              ((uint)ma_dr_flac__crc16_table
                                                     [(uint)(uVar10 >> 8) ^
                                                      (uint)(byte)(uVar9 >> 0x38)] << 8 ^
                                              (uint)ma_dr_flac__crc16_table
                                                    [((uint)uVar4 ^
                                                     ((uint)uVar10 << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [(uint)(uVar10 >> 8) ^
                                                            (uint)(byte)(uVar9 >> 0x38)]) >> 8 &
                                                     0xff) & 0xff]) >> 8 & 0xff) & 0xff] << 8 ^
                                      (uint)ma_dr_flac__crc16_table
                                            [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                             [((uint)uVar4 ^
                                                              ((uint)uVar10 << 8 ^
                                                              (uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar10 >> 8) ^
                                                                     (uint)(byte)(uVar9 >> 0x38)])
                                                              >> 8 & 0xff) & 0xff] << 8 ^
                                                      (uint)ma_dr_flac__crc16_table
                                                            [(uVar5 >> 8 ^
                                                             ((uint)ma_dr_flac__crc16_table
                                                                    [(uint)(uVar10 >> 8) ^
                                                                     (uint)(byte)(uVar9 >> 0x38)] <<
                                                              8 ^ (uint)ma_dr_flac__crc16_table
                                                                        [((uint)uVar4 ^
                                                                         ((uint)uVar10 << 8 ^
                                                                         (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar10 >> 8) ^ (uint)(byte)(uVar9 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff]) >> 8 & 0xff ^ uVar13 & 0xff] <<
                               8 ^ uVar8 ^
                              (uint)ma_dr_flac__crc16_table
                                    [(((uint)ma_dr_flac__crc16_table
                                             [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                              [((uint)uVar4 ^
                                                               ((uint)uVar10 << 8 ^
                                                               (uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar10 >> 8) ^
                                                                      (uint)(byte)(uVar9 >> 0x38)])
                                                               >> 8 & 0xff) & 0xff] << 8 ^
                                                       (uint)ma_dr_flac__crc16_table
                                                             [(uVar5 >> 8 ^
                                                              ((uint)ma_dr_flac__crc16_table
                                                                     [(uint)(uVar10 >> 8) ^
                                                                      (uint)(byte)(uVar9 >> 0x38)]
                                                               << 8 ^ (uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar4 ^
                                                                             ((uint)uVar10 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar10 >> 8) ^ (uint)(byte)(uVar9 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]) >>
                                                  8 & 0xff) & 0xff] << 8 ^
                                      (uint)ma_dr_flac__crc16_table
                                            [((uint)ma_dr_flac__crc16_table
                                                    [(uVar5 >> 8 ^
                                                     ((uint)ma_dr_flac__crc16_table
                                                            [(uint)(uVar10 >> 8) ^
                                                             (uint)(byte)(uVar9 >> 0x38)] << 8 ^
                                                     (uint)ma_dr_flac__crc16_table
                                                           [((uint)uVar4 ^
                                                            ((uint)uVar10 << 8 ^
                                                            (uint)ma_dr_flac__crc16_table
                                                                  [(uint)(uVar10 >> 8) ^
                                                                   (uint)(byte)(uVar9 >> 0x38)]) >>
                                                            8 & 0xff) & 0xff]) >> 8 & 0xff) & 0xff]
                                              << 8 ^ (uint)ma_dr_flac__crc16_table
                                                           [(uVar5 ^ ((uint)ma_dr_flac__crc16_table
                                                                            [((uint)uVar4 ^
                                                                             ((uint)uVar10 << 8 ^
                                                                             (uint)
                                                  ma_dr_flac__crc16_table
                                                  [(uint)(uVar10 >> 8) ^ (uint)(byte)(uVar9 >> 0x38)
                                                  ]) >> 8 & 0xff) & 0xff] << 8 ^
                                                  (uint)ma_dr_flac__crc16_table
                                                        [(uVar5 >> 8 ^
                                                         ((uint)ma_dr_flac__crc16_table
                                                                [(uint)(uVar10 >> 8) ^
                                                                 (uint)(byte)(uVar9 >> 0x38)] << 8 ^
                                                         (uint)ma_dr_flac__crc16_table
                                                               [((uint)uVar4 ^
                                                                ((uint)uVar10 << 8 ^
                                                                (uint)ma_dr_flac__crc16_table
                                                                      [(uint)(uVar10 >> 8) ^
                                                                       (uint)(byte)(uVar9 >> 0x38)])
                                                                >> 8 & 0xff) & 0xff]) >> 8 & 0xff) &
                                                         0xff]) >> 8 & 0xff) & 0xff]) >> 8 & 0xff ^
                                             uVar13 & 0xff]) >> 8 & 0xff ^ uVar14 & 0xffff) & 0xff])
                              >> 8 & 0xff]) >> 8 & 0xff ^ uVar8) & 0xff];
            (pFlac->bs).crc16 = uVar10;
            break;
          case 1:
            uVar12 = (ulong)(ushort)(uVar10 << 8 ^
                                    ma_dr_flac__crc16_table[(ushort)(uVar4 ^ uVar10 >> 8) & 0xff]);
          case 2:
            uVar12 = (ulong)(ushort)((ushort)((int)uVar12 << 8) ^
                                    ma_dr_flac__crc16_table
                                    [(uVar5 >> 8 ^ (uint)(uVar12 >> 8)) & 0xff]);
          case 3:
            uVar12 = (ulong)(ushort)((ushort)((int)uVar12 << 8) ^
                                    ma_dr_flac__crc16_table[(uVar5 ^ (uint)(uVar12 >> 8)) & 0xff]);
          case 4:
            uVar12 = (ulong)(ushort)((ushort)((int)uVar12 << 8) ^
                                    ma_dr_flac__crc16_table[(uint)(uVar12 >> 8) ^ uVar13 & 0xff]);
          case 5:
            uVar7 = (uint)(ushort)((ushort)((int)uVar12 << 8) ^
                                  ma_dr_flac__crc16_table
                                  [((uint)(uVar12 >> 8) ^ uVar14 & 0xffff) & 0xff]);
          case 6:
            uVar12 = (ulong)(ushort)((ushort)(uVar7 << 8) ^
                                    ma_dr_flac__crc16_table[(uVar8 ^ uVar7) >> 8 & 0xff]);
          case 7:
            uVar10 = (ushort)((int)uVar12 << 8) ^
                     ma_dr_flac__crc16_table[(uVar8 ^ (uint)(uVar12 >> 8)) & 0xff];
          default:
            (pFlac->bs).crc16 = uVar10;
            (pFlac->bs).crc16CacheIgnoredBytes = 0;
          }
        }
        else {
          uVar9 = uVar9 >> (-(char)uVar13 & 0x3fU);
          uVar14 = (uint)(uVar9 >> 0x20);
          switch(~(pFlac->bs).crc16CacheIgnoredBytes + (uVar13 >> 3)) {
          case 7:
            uVar7 = (uint)(ushort)(uVar10 << 8 ^
                                  ma_dr_flac__crc16_table
                                  [(uint)(uVar10 >> 8) ^ (uint)(byte)(uVar9 >> 0x38)]);
          case 6:
            uVar7 = (uint)(ushort)((ushort)(uVar7 << 8) ^
                                  ma_dr_flac__crc16_table
                                  [((uint)(ushort)(uVar9 >> 0x30) ^ uVar7 >> 8) & 0xff]);
          case 5:
            uVar7 = (uint)(ushort)((ushort)(uVar7 << 8) ^
                                  ma_dr_flac__crc16_table[(uVar14 ^ uVar7) >> 8 & 0xff]);
          case 4:
            uVar7 = (uint)(ushort)((ushort)(uVar7 << 8) ^
                                  ma_dr_flac__crc16_table[(uVar14 ^ uVar7 >> 8) & 0xff]);
          case 3:
            uVar7 = (uint)(ushort)((ushort)(uVar7 << 8) ^
                                  ma_dr_flac__crc16_table[uVar7 >> 8 ^ (uint)(uVar9 >> 0x18) & 0xff]
                                  );
          case 2:
            uVar7 = (uint)(ushort)((ushort)(uVar7 << 8) ^
                                  ma_dr_flac__crc16_table
                                  [(uVar7 >> 8 ^ (uint)(uVar9 >> 0x10) & 0xffff) & 0xff]);
          case 1:
            uVar12 = (ulong)(ushort)((ushort)(uVar7 << 8) ^
                                    ma_dr_flac__crc16_table[((uint)uVar9 ^ uVar7) >> 8 & 0xff]);
          case 0:
            uVar10 = (ushort)((int)uVar12 << 8) ^
                     ma_dr_flac__crc16_table[((uint)uVar9 ^ (uint)(uVar12 >> 8)) & 0xff];
          default:
            (pFlac->bs).crc16 = uVar10;
            (pFlac->bs).crc16CacheIgnoredBytes = uVar13 >> 3;
          }
        }
        mVar6 = ma_dr_flac__read_uint16(bs,0x10,(ma_uint16 *)((long)&uStack_38 + 6));
        if (mVar6 == 0) {
          mVar11 = MA_AT_END;
        }
        else {
          mVar11 = MA_CRC_MISMATCH;
          if (uVar10 == uStack_38._6_2_) {
            mVar11 = MA_SUCCESS;
          }
        }
      }
      return mVar11;
    }
  } while( true );
}

Assistant:

static ma_result ma_dr_flac__seek_flac_frame(ma_dr_flac* pFlac)
{
    int channelCount;
    int i;
    ma_uint16 desiredCRC16;
#ifndef MA_DR_FLAC_NO_CRC
    ma_uint16 actualCRC16;
#endif
    channelCount = ma_dr_flac__get_channel_count_from_channel_assignment(pFlac->currentFLACFrame.header.channelAssignment);
    for (i = 0; i < channelCount; ++i) {
        if (!ma_dr_flac__seek_subframe(&pFlac->bs, &pFlac->currentFLACFrame, i)) {
            return MA_ERROR;
        }
    }
    if (!ma_dr_flac__seek_bits(&pFlac->bs, MA_DR_FLAC_CACHE_L1_BITS_REMAINING(&pFlac->bs) & 7)) {
        return MA_ERROR;
    }
#ifndef MA_DR_FLAC_NO_CRC
    actualCRC16 = ma_dr_flac__flush_crc16(&pFlac->bs);
#endif
    if (!ma_dr_flac__read_uint16(&pFlac->bs, 16, &desiredCRC16)) {
        return MA_AT_END;
    }
#ifndef MA_DR_FLAC_NO_CRC
    if (actualCRC16 != desiredCRC16) {
        return MA_CRC_MISMATCH;
    }
#endif
    return MA_SUCCESS;
}